

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

void anon_unknown.dwarf_19333b::getResourceBundleKey
               (char *nsName,CompactStyle compactStyle,CompactType compactType,CharString *sb,
               UErrorCode *status)

{
  UErrorCode *pUVar1;
  char *pcVar2;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece s_02;
  undefined1 local_68 [12];
  undefined1 local_58 [12];
  undefined1 local_48 [12];
  undefined1 local_38 [12];
  UErrorCode *local_28;
  UErrorCode *status_local;
  CharString *sb_local;
  CompactType compactType_local;
  CompactStyle compactStyle_local;
  char *nsName_local;
  
  local_28 = status;
  status_local = (UErrorCode *)sb;
  sb_local._0_4_ = compactType;
  sb_local._4_4_ = compactStyle;
  _compactType_local = nsName;
  icu_63::CharString::clear(sb);
  pUVar1 = status_local;
  icu_63::StringPiece::StringPiece((StringPiece *)local_38,"NumberElements/");
  s._12_4_ = 0;
  s.ptr_ = (char *)local_38._0_8_;
  s.length_ = local_38._8_4_;
  icu_63::CharString::append((CharString *)pUVar1,s,local_28);
  pUVar1 = status_local;
  icu_63::StringPiece::StringPiece((StringPiece *)local_48,_compactType_local);
  s_00._12_4_ = 0;
  s_00.ptr_ = (char *)local_48._0_8_;
  s_00.length_ = local_48._8_4_;
  icu_63::CharString::append((CharString *)pUVar1,s_00,local_28);
  pUVar1 = status_local;
  pcVar2 = "/patternsLong";
  if (sb_local._4_4_ == UNUM_SHORT) {
    pcVar2 = "/patternsShort";
  }
  icu_63::StringPiece::StringPiece((StringPiece *)local_58,pcVar2);
  s_01._12_4_ = 0;
  s_01.ptr_ = (char *)local_58._0_8_;
  s_01.length_ = local_58._8_4_;
  icu_63::CharString::append((CharString *)pUVar1,s_01,local_28);
  pUVar1 = status_local;
  pcVar2 = "/currencyFormat";
  if ((CompactType)sb_local == TYPE_DECIMAL) {
    pcVar2 = "/decimalFormat";
  }
  icu_63::StringPiece::StringPiece((StringPiece *)local_68,pcVar2);
  s_02._12_4_ = 0;
  s_02.ptr_ = (char *)local_68._0_8_;
  s_02.length_ = local_68._8_4_;
  icu_63::CharString::append((CharString *)pUVar1,s_02,local_28);
  return;
}

Assistant:

void getResourceBundleKey(const char *nsName, CompactStyle compactStyle, CompactType compactType,
                                 CharString &sb, UErrorCode &status) {
    sb.clear();
    sb.append("NumberElements/", status);
    sb.append(nsName, status);
    sb.append(compactStyle == CompactStyle::UNUM_SHORT ? "/patternsShort" : "/patternsLong", status);
    sb.append(compactType == CompactType::TYPE_DECIMAL ? "/decimalFormat" : "/currencyFormat", status);
}